

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  pointer *pppEVar1;
  pointer *pppSVar2;
  pointer *pppEVar3;
  int iVar4;
  pointer pcVar5;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long *plVar9;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar10;
  MessageGenerator *this_00;
  pointer ppMVar11;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar12;
  EnumGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *psVar13;
  ServiceGenerator *this_02;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar14;
  ExtensionGenerator *this_03;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->file_ = file;
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar5 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options_,pcVar5,pcVar5 + (options->dllexport_decl)._M_string_length);
  bVar6 = options->table_driven_parsing;
  (this->options_).enforce_lite = options->enforce_lite;
  (this->options_).table_driven_parsing = bVar6;
  bVar6 = options->proto_h;
  bVar7 = options->transitive_pb_h;
  bVar8 = options->annotate_headers;
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  (this->options_).proto_h = bVar6;
  (this->options_).transitive_pb_h = bVar7;
  (this->options_).annotate_headers = bVar8;
  (this->options_).annotation_pragma_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_pragma_name.field_2;
  pcVar5 = (options->annotation_pragma_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_pragma_name,pcVar5,
             pcVar5 + (options->annotation_pragma_name)._M_string_length);
  (this->options_).annotation_guard_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_guard_name.field_2;
  pcVar5 = (options->annotation_guard_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_guard_name,pcVar5,
             pcVar5 + (options->annotation_guard_name)._M_string_length);
  SCCAnalyzer::SCCAnalyzer(&this->scc_analyzer_,options);
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = *(int *)(file + 0x58);
  lVar17 = (long)iVar4;
  uVar15 = lVar17 * 8;
  uVar16 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar16 = 0xffffffffffffffff;
  }
  if (lVar17 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar9 = (long *)operator_new__(uVar16);
  *plVar9 = lVar17;
  if (iVar4 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar9 + 1),0,uVar15);
  }
  (this->message_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar9 + 1);
  iVar4 = *(int *)(file + 0x68);
  lVar17 = (long)iVar4;
  uVar15 = lVar17 * 8;
  uVar16 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar16 = 0xffffffffffffffff;
  }
  if (lVar17 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar9 = (long *)operator_new__(uVar16);
  *plVar9 = lVar17;
  if (iVar4 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar9 + 1),0,uVar15);
  }
  (this->enum_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar9 + 1);
  iVar4 = *(int *)(file + 0x78);
  lVar17 = (long)iVar4;
  uVar15 = lVar17 * 8;
  uVar16 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar16 = 0xffffffffffffffff;
  }
  if (lVar17 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar9 = (long *)operator_new__(uVar16);
  *plVar9 = lVar17;
  if (iVar4 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar9 + 1),0,uVar15);
  }
  (this->service_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar9 + 1);
  iVar4 = *(int *)(file + 0x88);
  lVar17 = (long)iVar4;
  uVar15 = lVar17 * 8;
  uVar16 = uVar15 + 8;
  if (0xfffffffffffffff7 < uVar15) {
    uVar16 = 0xffffffffffffffff;
  }
  if (lVar17 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar9 = (long *)operator_new__(uVar16);
  *plVar9 = lVar17;
  if (iVar4 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar9 + 1),0,uVar15)
    ;
  }
  (this->extension_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar9 + 1);
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *(int *)(file + 0x58)) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
                ::operator[](&this->message_generators_owner_,lVar18);
      this_00 = (MessageGenerator *)operator_new(0x118);
      MessageGenerator::MessageGenerator
                (this_00,(Descriptor *)(*(long *)(file + 0x60) + lVar17),options,
                 &this->scc_analyzer_);
      internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset
                (psVar10,this_00);
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
                ::operator[](&this->message_generators_owner_,lVar18);
      if (psVar10->ptr_ == (MessageGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
                     );
      }
      MessageGenerator::Flatten(psVar10->ptr_,&this->message_generators_);
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0xa8;
    } while (lVar18 < *(int *)(file + 0x58));
  }
  ppMVar11 = (this->message_generators_).
             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar11) {
    uVar15 = 0;
    do {
      MessageGenerator::AddGenerators
                (ppMVar11[uVar15],&this->enum_generators_,&this->extension_generators_);
      uVar15 = uVar15 + 1;
      ppMVar11 = (this->message_generators_).
                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->message_generators_).
                                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar11 >> 3
                             ));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      psVar12 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
                ::operator[](&this->enum_generators_owner_,lVar18);
      this_01 = (EnumGenerator *)operator_new(0x38);
      EnumGenerator::EnumGenerator
                (this_01,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar17),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(psVar12,this_01);
      psVar12 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
                ::operator[](&this->enum_generators_owner_,lVar18);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar12->ptr_;
      __position._M_current =
           (this->enum_generators_).
           super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->enum_generators_).
          super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator*>
                  ((vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
                    *)&this->enum_generators_,__position,(EnumGenerator **)&local_68);
      }
      else {
        *__position._M_current =
             (EnumGenerator *)
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pppEVar1 = &(this->enum_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar18 < *(int *)(file + 0x68));
  }
  if (0 < *(int *)(file + 0x78)) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      psVar13 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator[](&this->service_generators_owner_,lVar18);
      this_02 = (ServiceGenerator *)operator_new(0x40);
      ServiceGenerator::ServiceGenerator
                (this_02,(ServiceDescriptor *)(*(long *)(file + 0x80) + lVar17),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::reset
                (psVar13,this_02);
      psVar13 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator[](&this->service_generators_owner_,lVar18);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar13->ptr_;
      __position_00._M_current =
           (this->service_generators_).
           super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->service_generators_).
          super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::ServiceGenerator*,std::allocator<google::protobuf::compiler::cpp::ServiceGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ServiceGenerator*>
                  ((vector<google::protobuf::compiler::cpp::ServiceGenerator*,std::allocator<google::protobuf::compiler::cpp::ServiceGenerator*>>
                    *)&this->service_generators_,__position_00,(ServiceGenerator **)&local_68);
      }
      else {
        *__position_00._M_current =
             (ServiceGenerator *)
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pppSVar2 = &(this->service_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppSVar2 = *pppSVar2 + 1;
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x30;
    } while (lVar18 < *(int *)(file + 0x78));
  }
  if (0 < *(int *)(file + 0x88)) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      psVar14 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_owner_,lVar18);
      this_03 = (ExtensionGenerator *)operator_new(0x90);
      ExtensionGenerator::ExtensionGenerator
                (this_03,(FieldDescriptor *)(*(long *)(file + 0x98) + lVar17),options);
      internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset
                (psVar14,this_03);
      psVar14 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_owner_,lVar18);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar14->ptr_;
      __position_01._M_current =
           (this->extension_generators_).
           super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_01._M_current ==
          (this->extension_generators_).
          super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator*>
                  ((vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
                    *)&this->extension_generators_,__position_01,(ExtensionGenerator **)&local_68);
      }
      else {
        *__position_01._M_current =
             (ExtensionGenerator *)
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pppEVar3 = &(this->extension_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar3 = *pppEVar3 + 1;
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0xa8;
    } while (lVar18 < *(int *)(file + 0x88));
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SplitStringUsing(*(string **)(this->file_ + 8),".",&local_48);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->package_parts_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->package_parts_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->package_parts_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file),
      options_(options),
      scc_analyzer_(options),
      message_generators_owner_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      enum_generators_owner_(
          new google::protobuf::scoped_ptr<EnumGenerator>[file->enum_type_count()]),
      service_generators_owner_(
          new google::protobuf::scoped_ptr<ServiceGenerator>[file->service_count()]),
      extension_generators_owner_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]) {

  for (int i = 0; i < file->message_type_count(); i++) {
    message_generators_owner_[i].reset(
        new MessageGenerator(file->message_type(i), options, &scc_analyzer_));
    message_generators_owner_[i]->Flatten(&message_generators_);
  }

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->AddGenerators(&enum_generators_,
                                          &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_owner_[i].reset(
        new EnumGenerator(file->enum_type(i), options));
    enum_generators_.push_back(enum_generators_owner_[i].get());
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_owner_[i].reset(
        new ServiceGenerator(file->service(i), options));
    service_generators_.push_back(service_generators_owner_[i].get());
  }

  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_owner_[i].reset(
        new ExtensionGenerator(file->extension(i), options));
    extension_generators_.push_back(extension_generators_owner_[i].get());
  }

  package_parts_ = Split(file_->package(), ".", true);
}